

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

void crnlib::crn_sleep(uint milliseconds)

{
  uint uVar1;
  
  for (; milliseconds != 0; milliseconds = milliseconds - uVar1) {
    uVar1 = 1000;
    if (milliseconds < 1000) {
      uVar1 = milliseconds;
    }
    usleep(uVar1 * 1000);
  }
  return;
}

Assistant:

void crn_sleep(unsigned int milliseconds)
    {
#ifdef WIN32
        struct timespec interval;
        interval.tv_sec = milliseconds / 1000;
        interval.tv_nsec = (milliseconds % 1000) * 1000000L;
        pthread_delay_np(&interval);
#else
        while (milliseconds)
        {
            int msecs_to_sleep = CRNLIB_MIN(milliseconds, 1000);
            usleep(msecs_to_sleep * 1000);
            milliseconds -= msecs_to_sleep;
        }
#endif
    }